

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGEnumeration<lunasvg::SpreadMethod>::parseEnum<3u>
          (SVGEnumeration<lunasvg::SpreadMethod> *this,string_view input,
          SVGEnumerationEntry<lunasvg::SpreadMethod> (*entries) [3])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  SVGEnumerationEntry<lunasvg::SpreadMethod> *entry;
  SVGEnumerationEntry<lunasvg::SpreadMethod> *__end0;
  SVGEnumerationEntry<lunasvg::SpreadMethod> *__begin0;
  SVGEnumerationEntry<lunasvg::SpreadMethod> (*__range2) [3];
  SVGEnumerationEntry<lunasvg::SpreadMethod> (*entries_local) [3];
  SVGEnumeration<lunasvg::SpreadMethod> *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGEnumeration<lunasvg::SpreadMethod> *)input._M_len;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  __end0 = *entries;
  while( true ) {
    if (__end0 == entries[1]) {
      return false;
    }
    __x._M_str = (char *)input_local._M_len;
    __x._M_len = (size_t)this_local;
    bVar1 = std::operator==(__x,__end0->second);
    if (bVar1) break;
    __end0 = __end0 + 1;
  }
  (this->super_SVGProperty).field_0x9 = __end0->first;
  return true;
}

Assistant:

bool SVGEnumeration<Enum>::parseEnum(std::string_view input, const SVGEnumerationEntry<Enum>(&entries)[N])
{
    stripLeadingAndTrailingSpaces(input);
    for(const auto& entry : entries) {
        if(input == entry.second) {
            m_value = entry.first;
            return true;
        }
    }

    return false;
}